

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcLoad.c
# Opt level: O1

int Bmc_LoadAddCnf(void *pMan,int iLit)

{
  ulong *puVar1;
  int iVar2;
  long lVar3;
  ulong *puVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int Lits [3];
  uint local_24;
  uint local_20;
  uint local_1c;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  if (*(int *)(*(long *)((long)pMan + 0x18) + 4) <= (int)((uint)iLit >> 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar6 = *(int *)(*(long *)(*(long *)((long)pMan + 0x18) + 8) + (ulong)((uint)iLit >> 1) * 4);
  lVar7 = (long)iVar6;
  if (-1 < lVar7) {
    iVar2 = *(int *)(*(long *)((long)pMan + 8) + 0x18);
    if (iVar6 < iVar2) {
      lVar3 = *(long *)(*(long *)((long)pMan + 8) + 0x20);
      *(int *)((long)pMan + 0x20) = *(int *)((long)pMan + 0x20) + 1;
      uVar9 = *(ulong *)(lVar3 + lVar7 * 0xc);
      iVar5 = 0;
      if ((~uVar9 & 0x1fffffff1fffffff) != 0 && (~uVar9 & 0x9fffffff) != 0) {
        uVar8 = (uint)uVar9;
        if (((int)uVar8 < 0) || ((uVar8 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcLoad.c"
                        ,0x4f,"int Bmc_LoadAddCnf(void *, int)");
        }
        if ((iLit & 1U) == 0) {
          if ((uVar8 >> 0x1e & 1) != 0) {
            return 0;
          }
        }
        else if ((uVar9 >> 0x3e & 1) != 0) {
          return 0;
        }
        puVar1 = (ulong *)(lVar3 + lVar7 * 0xc);
        local_24 = iLit ^ 1;
        if ((iLit & 1U) == 0) {
          if (iVar2 <= iVar6) {
LAB_00540006:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar6 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,iVar6 - ((uint)*puVar1 & 0x1fffffff));
          if (iVar6 < 0) {
LAB_00540044:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          local_20 = ((uint)*puVar1 >> 0x1d & 1) + iVar6 * 2;
          sat_solver_clause_new
                    (*(sat_solver **)((long)pMan + 0x10),(lit *)&local_24,(lit *)&local_1c,0);
          puVar4 = *(ulong **)(*(long *)((long)pMan + 8) + 0x20);
          if ((puVar1 < puVar4) ||
             ((ulong *)((long)puVar4 + (long)*(int *)(*(long *)((long)pMan + 8) + 0x18) * 0xc) <=
              puVar1)) goto LAB_00540006;
          iVar6 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,
                                    (int)((ulong)((long)puVar1 - (long)puVar4) >> 2) * -0x55555555 -
                                    (*(uint *)((long)puVar1 + 4) & 0x1fffffff));
          if (iVar6 < 0) goto LAB_00540044;
          local_20 = ((uint)(*puVar1 >> 0x3d) & 1) + iVar6 * 2;
          sat_solver_clause_new
                    (*(sat_solver **)((long)pMan + 0x10),(lit *)&local_24,(lit *)&local_1c,0);
          uVar9 = 0x40000000;
        }
        else {
          if (iVar2 <= iVar6) goto LAB_00540006;
          iVar6 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,iVar6 - ((uint)*puVar1 & 0x1fffffff));
          if (iVar6 < 0) goto LAB_00540044;
          local_20 = ((uint)*puVar1 >> 0x1d & 1) + iVar6 * 2 ^ 1;
          puVar4 = *(ulong **)(*(long *)((long)pMan + 8) + 0x20);
          if ((puVar1 < puVar4) ||
             ((ulong *)((long)puVar4 + (long)*(int *)(*(long *)((long)pMan + 8) + 0x18) * 0xc) <=
              puVar1)) goto LAB_00540006;
          iVar6 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,
                                    (int)((ulong)((long)puVar1 - (long)puVar4) >> 2) * -0x55555555 -
                                    (*(uint *)((long)puVar1 + 4) & 0x1fffffff));
          if (iVar6 < 0) goto LAB_00540044;
          uVar9 = 0x4000000000000000;
          local_1c = ((uint)(*puVar1 >> 0x3d) & 1) + iVar6 * 2 ^ 1;
          sat_solver_clause_new
                    (*(sat_solver **)((long)pMan + 0x10),(lit *)&local_24,
                     (lit *)&stack0xffffffffffffffe8,0);
        }
        *puVar1 = *puVar1 | uVar9;
        *(int *)((long)pMan + 0x24) = *(int *)((long)pMan + 0x24) + 1;
        iVar5 = 1;
      }
      return iVar5;
    }
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Bmc_LoadAddCnf( void * pMan, int iLit )
{
    Bmc_Load_t * p = (Bmc_Load_t *)pMan;
    int Lits[3], iVar = Abc_Lit2Var(iLit);
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, Vec_IntEntry(p->vSat2Id, iVar) );
    p->nCallBacks1++;
    if ( Gia_ObjIsCi(pObj) || Gia_ObjIsConst0(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( (Abc_LitIsCompl(iLit) ? pObj->fMark1 : pObj->fMark0) )
        return 0;
    Lits[0] = Abc_LitNot(iLit);
    if ( Abc_LitIsCompl(iLit) )
    {
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(p->pGia, pObj)), !Gia_ObjFaninC0(pObj) );
        Lits[2] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId1p(p->pGia, pObj)), !Gia_ObjFaninC1(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 3, 0 );
        pObj->fMark1 = 1;
    }
    else
    {
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(p->pGia, pObj)), Gia_ObjFaninC0(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 2, 0 );
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId1p(p->pGia, pObj)), Gia_ObjFaninC1(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 2, 0 );
        pObj->fMark0 = 1;
    }
    p->nCallBacks2++;
    return 1;
}